

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_set_i32(ggml_tensor *tensor,int32_t value)

{
  int n;
  size_t sVar1;
  uint uVar2;
  undefined8 uVar3;
  float *x;
  ulong uVar4;
  bool bVar5;
  
  if (GGML_TYPE_COUNT < tensor->type) {
    return tensor;
  }
  uVar2 = tensor->ne[2] * tensor->ne[1] * tensor->ne[3];
  n = tensor->ne[0];
  sVar1 = tensor->nb[1];
  x = (float *)tensor->data;
  switch(tensor->type) {
  case GGML_TYPE_Q4_0:
    uVar3 = 0xa98;
    goto LAB_00117f46;
  case GGML_TYPE_Q4_1:
    uVar3 = 0xa9c;
    goto LAB_00117f46;
  case GGML_TYPE_I8:
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      ggml_vec_set_i8(n,(int8_t *)x,(int8_t)value);
      x = (float *)((long)x + sVar1);
    }
    break;
  case GGML_TYPE_I16:
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      ggml_vec_set_i16(n,(int16_t *)x,(int16_t)value);
      x = (float *)((long)x + sVar1);
    }
    break;
  case GGML_TYPE_I32:
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      ggml_vec_set_i32(n,(int32_t *)x,value);
      x = (float *)((long)x + sVar1);
    }
    break;
  case GGML_TYPE_F16:
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      ggml_vec_set_f16(n,(ggml_fp16_t *)x,value);
      x = (float *)((long)x + sVar1);
    }
    break;
  case GGML_TYPE_F32:
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      ggml_vec_set_f32(n,x,(float)value);
      x = (float *)((long)x + sVar1);
    }
    break;
  case GGML_TYPE_COUNT:
    uVar3 = 0xac3;
LAB_00117f46:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar3,
            "false");
    abort();
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_i32 (struct ggml_tensor * tensor, int32_t value) {
    const int n     = ggml_nrows(tensor);
    const int nc    = tensor->ne[0];
    const size_t n1 = tensor->nb[1];

    char * const data = tensor->data;

    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                assert(tensor->nb[0] == sizeof(int8_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i8(nc, (int8_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I16:
            {
                assert(tensor->nb[0] == sizeof(int16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i16(nc, (int16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I32:
            {
                assert(tensor->nb[0] == sizeof(int32_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i32(nc, (int32_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F16:
            {
                assert(tensor->nb[0] == sizeof(ggml_fp16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f16(nc, (ggml_fp16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F32:
            {
                assert(tensor->nb[0] == sizeof(float));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f32(nc, (float *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return tensor;
}